

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::PRE::PreloadPRECandidates(PRE *this,Loop *loop)

{
  BasicBlock *pBVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar7;
  Type *ppHVar8;
  long lVar9;
  Func **ppFVar10;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  if ((this->candidates != (PRECandidates *)0x0) &&
     (this->candidates->candidatesList != (PRECandidatesList *)0x0)) {
    pBVar1 = loop->landingPad;
    pBVar2 = pBVar1->next;
    ppFVar10 = (Func **)&pBVar2->firstInstr;
    if (pBVar2 == (BasicBlock *)0x0) {
      ppFVar10 = &pBVar1->func;
    }
    lVar9 = 0x18;
    if (pBVar2 == (BasicBlock *)0x0) {
      lVar9 = 0xd0;
    }
    iter.super_EditingIterator.last = (NodeBase *)loop;
    if (pBVar1->firstInstr != *(Instr **)((long)&(*ppFVar10)->m_alloc + lVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x475,
                         "(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr())",
                         "loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    bVar4 = true;
    while (bVar4) {
      local_50 = (undefined1  [8])this->candidates->candidatesList;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      bVar4 = false;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
      while( true ) {
        bVar5 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_50);
        if (!bVar5) break;
        ppHVar8 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)local_50);
        BVar6 = PreloadPRECandidate(this,(Loop *)iter.super_EditingIterator.last,*ppHVar8);
        if (BVar6 != 0) {
          SList<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
          RemoveCurrent((EditingIterator *)local_50);
          bVar4 = true;
        }
        sourceContextId = Func::GetSourceContextId(this->globOpt->func);
        functionId = Func::GetLocalFunctionId(this->globOpt->func);
        bVar5 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01453738,FieldPREPhase,sourceContextId,functionId);
        if (bVar5) {
          Output::Print(L"============================\n");
          Output::Flush();
        }
      }
    }
  }
  return;
}

Assistant:

void GlobOpt::PRE::PreloadPRECandidates(Loop *loop)
{
    // Insert loads in landing pad for field PRE candidates. Iterate while(changed)
    // for the o.x.y cases.
    BOOL changed = true;

    if (!candidates || !candidates->candidatesList)
    {
        return;
    }

    Assert(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr());

    while (changed)
    {
        changed = false;
        FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, (SList<GlobHashBucket*>*)candidates->candidatesList, iter)
        {
            if (this->PreloadPRECandidate(loop, candidate))
            {
                changed = true;
                iter.RemoveCurrent();
            }
            if (PHASE_TRACE(Js::FieldPREPhase, this->globOpt->func))
            {
                Output::Print(_u("============================\n"));
                Output::Flush();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }
}